

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Parenthesizer::Parenthesizer
          (Parenthesizer *this,ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *w,Expr e,
          int prec)

{
  int iVar1;
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  BasicWriter<char> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  *in_RDI = in_RSI;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(in_RSI + 0x10);
  local_1c = in_ECX;
  if (in_ECX == -1) {
    local_1c = *(int *)(in_RSI + 0x10);
  }
  iVar1 = precedence((Expr)0x19848e);
  *(bool *)((long)in_RDI + 0xc) = iVar1 < local_1c;
  if ((*(byte *)((long)in_RDI + 0xc) & 1) != 0) {
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,(char)((ulong)in_RDI >> 0x38));
  }
  iVar1 = precedence((Expr)0x1984ce);
  *(int *)(in_RSI + 0x10) = iVar1;
  return;
}

Assistant:

ExprWriter<ExprTypes, VarNamer>::Parenthesizer::Parenthesizer(
    ExprWriter<ExprTypes, VarNamer> &w, Expr e, int prec)
: writer_(w), write_paren_(false) {
  saved_precedence_ = w.precedence_;
  if (prec == -1)
    prec = w.precedence_;
  write_paren_ = precedence(e) < prec;
  if (write_paren_)
    w.writer_ << '(';
  w.precedence_ = precedence(e);
}